

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  pointer *dbname;
  long *plVar1;
  DB DVar2;
  unsigned_long *puVar3;
  iterator iVar4;
  bool *max_sequence_00;
  char cVar5;
  bool bVar6;
  VersionEdit *in_RCX;
  DBImpl *pDVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar11;
  Status s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  FileType type;
  SequenceNumber max_sequence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  uint64_t number;
  char buf [50];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  DB local_168;
  DBImpl *local_160;
  unsigned_long *local_158;
  iterator iStack_150;
  unsigned_long *local_148;
  FileType local_13c;
  VersionEdit *local_138;
  ulong local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  ulong local_108;
  ulong local_100;
  bool *local_f8;
  ulong local_f0;
  undefined1 local_e8 [64];
  undefined1 local_a8 [8];
  Logger *local_a0;
  _Link_type local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  size_t local_80;
  WritableFile *local_78;
  undefined1 local_70 [32];
  Slice local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  dbname = &(edit->new_files_).
            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_160 = this;
  local_138 = in_RCX;
  local_f8 = save_manifest;
  (**(code **)(*plVar1 + 0x50))(&local_78,plVar1,dbname);
  if (local_78 != (WritableFile *)0x0) {
    operator_delete__(local_78);
  }
  if (*(long *)((long)&edit[1].comparator_.field_2 + 8) != 0) {
    __assert_fail("db_lock_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x128,"Status leveldb::DBImpl::Recover(VersionEdit *, bool *)");
  }
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  LockFileName((string *)local_e8,(string *)dbname);
  (**(code **)(*plVar1 + 0x78))
            (&local_168,plVar1,(string *)local_e8,
             (undefined1 *)((long)&edit[1].comparator_.field_2 + 8));
  if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_);
  }
  if ((pointer)local_168._vptr_DB == (pointer)0x0) {
    plVar1 = (long *)(edit->comparator_)._M_string_length;
    CurrentFileName((string *)local_e8,(string *)dbname);
    cVar5 = (**(code **)(*plVar1 + 0x30))(plVar1,(string *)local_e8);
    if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_);
    }
    pDVar7 = local_160;
    if (cVar5 == '\0') {
      if ((char)edit->last_sequence_ != '\x01') {
        local_e8._0_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_e8._8_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8 = (undefined1  [8])0x15787f;
        local_a0 = (Logger *)0x2b;
        goto LAB_0011280e;
      }
      NewDB((DBImpl *)local_e8);
      DVar2._vptr_DB = local_168._vptr_DB;
      local_168._vptr_DB = (_func_int **)local_e8._0_8_;
      local_e8._0_8_ = DVar2._vptr_DB;
      if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
        operator_delete__(DVar2._vptr_DB);
      }
      if ((pointer)local_168._vptr_DB == (pointer)0x0) goto LAB_00112717;
    }
    else {
      if (*(char *)((long)&edit->last_sequence_ + 1) == '\x01') {
        local_e8._0_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_e8._8_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8 = (undefined1  [8])0x1578ab;
        local_a0 = (Logger *)0x20;
LAB_0011280e:
        Status::Status((Status *)local_160,kInvalidArgument,(Slice *)local_e8,(Slice *)local_a8);
        goto LAB_0011262e;
      }
LAB_00112717:
      VersionSet::Recover((VersionSet *)local_e8,(bool *)edit[3].next_file_number_);
      DVar2._vptr_DB = local_168._vptr_DB;
      local_168._vptr_DB = (_func_int **)local_e8._0_8_;
      local_e8._0_8_ = DVar2._vptr_DB;
      if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
        operator_delete__(DVar2._vptr_DB);
      }
      if ((pointer)local_168._vptr_DB == (pointer)0x0) {
        local_130 = 0;
        uVar9 = *(ulong *)(edit[3].next_file_number_ + 0x60);
        local_100 = *(ulong *)(edit[3].next_file_number_ + 0x68);
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        plVar1 = (long *)(edit->comparator_)._M_string_length;
        (**(code **)(*plVar1 + 0x38))(local_e8,plVar1,dbname);
        DVar2._vptr_DB = local_168._vptr_DB;
        local_168._vptr_DB = (_func_int **)local_e8._0_8_;
        local_e8._0_8_ = DVar2._vptr_DB;
        if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
          operator_delete__(DVar2._vptr_DB);
        }
        if ((pointer)local_168._vptr_DB == (pointer)0x0) {
          local_90 = (_Base_ptr)(local_a8 + 8);
          local_a0 = (Logger *)((ulong)local_a0 & 0xffffffff00000000);
          local_98 = (_Link_type)0x0;
          local_80 = 0;
          local_88 = local_90;
          VersionSet::AddLiveFiles
                    ((VersionSet *)edit[3].next_file_number_,
                     (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )local_a8);
          local_148 = (unsigned_long *)0x0;
          local_158 = (unsigned_long *)0x0;
          iStack_150._M_current = (unsigned_long *)0x0;
          local_108 = uVar9;
          if (local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar8 = 0;
            uVar9 = 0;
            do {
              bVar6 = ParseFileName((string *)
                                    ((long)&((local_128.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar8),&local_f0,&local_13c);
              if (bVar6) {
                pVar11 = std::
                         _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                        *)local_a8,&local_f0);
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)local_a8,(_Base_ptr)pVar11.first._M_node,
                               (_Base_ptr)pVar11.second._M_node);
                if ((local_13c == kLogFile) && ((local_108 <= local_f0 || (local_f0 == local_100))))
                {
                  if (iStack_150._M_current == local_148) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,
                               iStack_150,&local_f0);
                  }
                  else {
                    *iStack_150._M_current = local_f0;
                    iStack_150._M_current = iStack_150._M_current + 1;
                  }
                }
              }
              uVar9 = uVar9 + 1;
              lVar8 = lVar8 + 0x20;
            } while (uVar9 < (ulong)((long)local_128.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_128.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          iVar4._M_current = iStack_150._M_current;
          puVar3 = local_158;
          if (local_80 == 0) {
            if (local_158 != iStack_150._M_current) {
              uVar9 = (long)iStack_150._M_current - (long)local_158 >> 3;
              lVar8 = 0x3f;
              if (uVar9 != 0) {
                for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_158,iStack_150._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar3,iVar4._M_current);
            }
            max_sequence_00 = local_f8;
            if ((long)iStack_150._M_current - (long)local_158 != 0) {
              uVar9 = (long)iStack_150._M_current - (long)local_158 >> 3;
              uVar10 = 0;
              do {
                RecoverLogFile((DBImpl *)local_e8,(uint64_t)edit,SUB81(local_158[uVar10],0),
                               (bool *)(ulong)(uVar10 == uVar9 - 1),local_138,
                               (SequenceNumber *)max_sequence_00);
                DVar2._vptr_DB = local_168._vptr_DB;
                local_168._vptr_DB = (_func_int **)local_e8._0_8_;
                local_e8._0_8_ = DVar2._vptr_DB;
                if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
                  operator_delete__(DVar2._vptr_DB);
                }
                if ((pointer)local_168._vptr_DB != (pointer)0x0) {
                  (local_160->super_DB)._vptr_DB = local_168._vptr_DB;
                  local_168._vptr_DB = (_func_int **)0x0;
                  pDVar7 = local_160;
                  goto LAB_00112aed;
                }
                VersionSet::MarkFileNumberUsed
                          ((VersionSet *)edit[3].next_file_number_,local_158[uVar10]);
                uVar10 = uVar10 + 1;
                uVar9 = (long)iStack_150._M_current - (long)local_158 >> 3;
              } while (uVar10 < uVar9);
            }
            if (*(ulong *)(edit[3].next_file_number_ + 0x58) < local_130) {
              *(ulong *)(edit[3].next_file_number_ + 0x58) = local_130;
            }
            (local_160->super_DB)._vptr_DB = (_func_int **)0x0;
            pDVar7 = local_160;
          }
          else {
            snprintf(local_e8,0x32,"%d missing files; e.g.");
            local_40._M_allocated_capacity = (size_type)local_e8;
            local_40._8_8_ = strlen(local_e8);
            TableFileName((string *)local_70,(string *)dbname,*(uint64_t *)(local_90 + 1));
            pDVar7 = local_160;
            local_50.data_ = (char *)local_70._0_8_;
            local_50.size_ = local_70._8_8_;
            Status::Status((Status *)local_160,kCorruption,(Slice *)&local_40,&local_50);
            if ((Writer *)local_70._0_8_ != (Writer *)(local_70 + 0x10)) {
              operator_delete((void *)local_70._0_8_);
            }
          }
LAB_00112aed:
          if (local_158 != (unsigned_long *)0x0) {
            operator_delete(local_158);
          }
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::_M_erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_a8,local_98);
        }
        else {
          (local_160->super_DB)._vptr_DB = local_168._vptr_DB;
          local_168._vptr_DB = (_func_int **)0x0;
          pDVar7 = local_160;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
        goto LAB_0011262e;
      }
    }
  }
  (local_160->super_DB)._vptr_DB = local_168._vptr_DB;
  local_168._vptr_DB = (_func_int **)0x0;
  pDVar7 = local_160;
LAB_0011262e:
  if ((pointer)local_168._vptr_DB != (pointer)0x0) {
    operator_delete__(local_168._vptr_DB);
  }
  return (Status)(char *)pDVar7;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    std::snprintf(buf, sizeof(buf), "%d missing files; e.g.",
                  static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}